

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_rr.c
# Opt level: O0

void test_read_format_isojoliet_rr(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  char *pcVar5;
  la_int64_t lVar6;
  time_t tVar7;
  long v2;
  stat_conflict *psVar8;
  longlong local_38;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  
  ae = (archive_entry *)anon_var_dwarf_2527d;
  extract_reference_file("test_read_format_iso_joliet_rockridge.iso.Z");
  p = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'C',(uint)((archive *)p != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'D',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'E',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename((archive_conflict *)p,(char *)ae,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'G',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'J',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'K',".","\".\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'L',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'M',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
  tVar7 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'N',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  v2 = archive_entry_mtime_nsec((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'O',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  psVar8 = archive_entry_stat((archive_entry_conflict *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'P',3,"3",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'Q',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  iVar1 = archive_read_data_block((archive *)p,(void **)&size,(size_t *)&offset,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'S',1,"ARCHIVE_EOF",(long)iVar1,
                      "archive_read_data_block(a, &p, &size, &offset)",p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'T',(long)(int)offset,"(int)size",0,"0",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'U',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'V',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'Y',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'Z',"dir","\"dir\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'[',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\\',0x800,"2048",lVar6,"archive_entry_size(ae)",(void *)0x0);
  tVar7 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L']',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  tVar7 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'^',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  psVar8 = archive_entry_stat((archive_entry_conflict *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'_',2,"2",psVar8->st_nlink,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'`',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'a',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'b',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'c',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'g',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'i',"hardlink","\"hardlink\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'j',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  pcVar5 = archive_entry_hardlink((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'k',(uint)(pcVar5 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'l',6,"6",lVar6,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_data_block((archive *)p,(void **)&size,(size_t *)&offset,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'm',0,"0",(long)iVar1,"archive_read_data_block(a, &p, &size, &offset)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'n',6,"6",(long)(int)offset,"(int)size",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'o',0,"0",local_38,"offset",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'p',(void *)size,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
  tVar7 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'q',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'w',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'x',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'y',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'z',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'{',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x7f',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x81',"long-joliet-file-name.textfile","\"long-joliet-file-name.textfile\"",pcVar5,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x82',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                      (void *)0x0);
  pcVar5 = archive_entry_hardlink((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x84',"hardlink","\"hardlink\"",pcVar5,"archive_entry_hardlink(ae)",(void *)0x0,
             L'\0');
  wVar2 = archive_entry_size_is_set((archive_entry *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'\x85',(wVar2 != L'\0' ^ 0xff) & 1,"!archive_entry_size_is_set(ae)",(void *)0x0
                  );
  tVar7 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x86',0x15181,"86401",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  tVar7 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x87',0x15181,"86401",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x89',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8a',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8b',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8c',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8d',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x90',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar5 = archive_entry_pathname((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x91',"symlink","\"symlink\"",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  mVar3 = archive_entry_filetype((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x92',0xa000,"AE_IFLNK",(ulong)mVar3,"archive_entry_filetype(ae)",
                      (void *)0x0);
  pcVar5 = archive_entry_symlink((archive_entry *)a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x94',"long-joliet-file-name.textfile","\"long-joliet-file-name.textfile\"",pcVar5,
             "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  lVar6 = archive_entry_size((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x95',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  tVar7 = archive_entry_mtime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x96',0x2a302,"172802",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
  tVar7 = archive_entry_atime((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x97',0x2a302,"172802",tVar7,"archive_entry_atime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x98',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  lVar6 = archive_entry_uid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x99',1,"1",lVar6,"archive_entry_uid(ae)",(void *)0x0);
  lVar6 = archive_entry_gid((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9a',2,"2",lVar6,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9b',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9c',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",p);
  iVar1 = archive_read_next_header((archive *)p,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9f',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code((archive *)p,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'¢',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'£',(long)iVar1,"archive_format(a)",0x40001,
                      "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
  iVar1 = archive_read_close((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'¦',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",p);
  iVar1 = archive_read_free((archive *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'§',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_rr)
{
	const char *refname = "test_read_format_iso_joliet_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("dir", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names ("hardlink" gets returned
	 * first, so it's not marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);
	assertEqualInt(86401, archive_entry_mtime(ae));
	/* mkisofs records their access time. */
	/*assertEqualInt(86401, archive_entry_atime(ae));*/
	/* TODO: Actually, libarchive should be able to
	 * compute nlinks correctly even without RR
	 * extensions. See comments in libarchive source. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("hardlink",
	    archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	/* TODO: See above. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A symlink to the regular file. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_symlink(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(172802, archive_entry_mtime(ae));
	assertEqualInt(172802, archive_entry_atime(ae));
	assertEqualInt(1, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}